

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86_64.c
# Opt level: O3

void x86_64_package_end(dill_stream s)

{
  void *ptr;
  char *pcVar1;
  
  x86_64_proc_ret(s);
  x86_64_branch_link(s);
  x86_64_emit_save(s);
  for (pcVar1 = s->p->code_base; pcVar1 < s->p->code_limit; pcVar1 = pcVar1 + 8) {
    clflush(*pcVar1);
  }
  return;
}

Assistant:

extern void
x86_64_package_end(dill_stream s)
{
    x86_64_proc_ret(s);
    x86_64_branch_link(s);
    x86_64_emit_save(s);
    x86_64_flush(s->p->code_base, s->p->code_limit);
}